

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int read_StreamsInfo(archive_read *a,_7z_stream_info *si)

{
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  archive_read *a_00;
  archive_read *in_RSI;
  long in_RDI;
  _7z_folder *f;
  uint32_t packIndex;
  uint64_t packPos;
  _7z_folder *in_stack_00000018;
  uint i;
  uchar *p;
  _7zip_conflict *zip;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar4;
  archive_read *in_stack_ffffffffffffffc8;
  _7z_folder *p_Var5;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  archive_read *in_stack_ffffffffffffffd8;
  _7z_coders_info *ci;
  int local_4;
  
  ci = (_7z_coders_info *)**(long **)(in_RDI + 0x948);
  memset(in_RSI,0,0x68);
  a_00 = (archive_read *)
         header_bytes(in_stack_ffffffffffffffd8,
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (a_00 == (archive_read *)0x0) {
    return -1;
  }
  if ((uchar)(a_00->archive).magic == '\x06') {
    iVar3 = read_PackInfo(in_stack_ffffffffffffffc8,
                          (_7z_pack_info *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (iVar3 < 0) {
      return -1;
    }
    if (((in_RSI->archive).compression_name == (char *)0x0) ||
       (*(long *)&(in_RSI->archive).archive_format == 0)) {
      return -1;
    }
    p_Var5 = *(_7z_folder **)&in_RSI->archive;
    for (in_stack_ffffffffffffffd4 = 0;
        (archive_vtable_conflict *)(ulong)in_stack_ffffffffffffffd4 < (in_RSI->archive).vtable;
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
      *(_7z_folder **)((in_RSI->archive).compression_name + (ulong)in_stack_ffffffffffffffd4 * 8) =
           p_Var5;
      p_Var5 = (_7z_folder *)
               ((long)&p_Var5->numCoders +
               *(long *)(*(long *)&(in_RSI->archive).archive_format +
                        (ulong)in_stack_ffffffffffffffd4 * 8));
      if (ci[5].folders < p_Var5) {
        return -1;
      }
    }
    a_00 = (archive_read *)
           header_bytes(a_00,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (a_00 == (archive_read *)0x0) {
      return -1;
    }
  }
  if ((uchar)(a_00->archive).magic == '\a') {
    iVar3 = read_CodersInfo(in_RSI,ci);
    if (iVar3 < 0) {
      return -1;
    }
    uVar4 = 0;
    pcVar1 = (in_RSI->archive).error;
    for (in_stack_ffffffffffffffd4 = 0; uVar2._0_4_ = (in_RSI->archive).file_count,
        uVar2._4_4_ = (in_RSI->archive).archive_error_number, in_stack_ffffffffffffffd4 < uVar2;
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
      *(uint *)(pcVar1 + (ulong)in_stack_ffffffffffffffd4 * 0x68 + 0x58) = uVar4;
      uVar4 = (int)*(undefined8 *)(pcVar1 + (ulong)in_stack_ffffffffffffffd4 * 0x68 + 0x20) + uVar4;
      if ((in_RSI->archive).vtable < (archive_vtable_conflict *)(ulong)uVar4) {
        return -1;
      }
    }
    a_00 = (archive_read *)
           header_bytes(a_00,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (a_00 == (archive_read *)0x0) {
      return -1;
    }
  }
  if ((uchar)(a_00->archive).magic == '\b') {
    iVar3 = read_SubStreamsInfo((archive_read *)zip,(_7z_substream_info *)p,in_stack_00000018,
                                packPos);
    if (iVar3 < 0) {
      return -1;
    }
    a_00 = (archive_read *)
           header_bytes(a_00,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (a_00 == (archive_read *)0x0) {
      return -1;
    }
  }
  if ((uchar)(a_00->archive).magic == '\0') {
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int
read_StreamsInfo(struct archive_read *a, struct _7z_stream_info *si)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	unsigned i;

	memset(si, 0, sizeof(*si));

	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kPackInfo) {
		uint64_t packPos;

		if (read_PackInfo(a, &(si->pi)) < 0)
			return (-1);

		if (si->pi.positions == NULL || si->pi.sizes == NULL)
			return (-1);
		/*
		 * Calculate packed stream positions.
		 */
		packPos = si->pi.pos;
		for (i = 0; i < si->pi.numPackStreams; i++) {
			si->pi.positions[i] = packPos;
			packPos += si->pi.sizes[i];
			if (packPos > zip->header_offset)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kUnPackInfo) {
		uint32_t packIndex;
		struct _7z_folder *f;

		if (read_CodersInfo(a, &(si->ci)) < 0)
			return (-1);

		/*
		 * Calculate packed stream indexes.
		 */
		packIndex = 0;
		f = si->ci.folders;
		for (i = 0; i < si->ci.numFolders; i++) {
			f[i].packIndex = packIndex;
			packIndex += (uint32_t)f[i].numPackedStreams;
			if (packIndex > si->pi.numPackStreams)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	if (*p == kSubStreamsInfo) {
		if (read_SubStreamsInfo(a, &(si->ss),
		    si->ci.folders, (size_t)si->ci.numFolders) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 *  Must be kEnd.
	 */
	if (*p != kEnd)
		return (-1);
	return (0);
}